

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApproxCheck.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_31ee::ApproxCheck::checkUseChain
          (ApproxCheck *this,Instruction *instr,int level,
          vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *history)

{
  pointer *pppVVar1;
  ApproxCheck *pAVar2;
  iterator __position;
  iterator __position_00;
  pointer ppIVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  pointer ppIVar8;
  Instruction *vi_00;
  Instruction *pIVar9;
  bool bVar10;
  Instruction *vi;
  Value *evalAddrInst;
  string newopcode;
  string opcode;
  ApproxCheck *local_d0;
  int local_c4;
  ApproxCheck *local_c0;
  vector<llvm::Instruction*,std::allocator<llvm::Instruction*>> *local_b8;
  Value *local_b0;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> local_a8;
  long *local_90 [2];
  long local_80 [2];
  vector<llvm::Value*,std::allocator<llvm::Value*>> *local_70;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  
  local_c4 = level;
  local_b8 = (vector<llvm::Instruction*,std::allocator<llvm::Instruction*>> *)history;
  pcVar7 = (char *)llvm::Instruction::getOpcodeName((byte)instr[0x10] - 0x1b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,pcVar7,(allocator<char> *)local_90);
  iVar5 = std::__cxx11::string::compare((char *)local_50);
  bVar10 = iVar5 == 0;
  uVar6 = *(uint *)(instr + 0x14);
  if ((uVar6 >> 0x1e & 1) == 0) {
    pIVar9 = instr + -(ulong)(uVar6 << 5);
  }
  else {
    pIVar9 = *(Instruction **)(instr + -8);
  }
  local_c4 = local_c4 + 1;
  local_70 = (vector<llvm::Value*,std::allocator<llvm::Value*>> *)&this->addrList;
  local_c0 = this;
  do {
    if ((uVar6 >> 0x1e & 1) == 0) {
      vi_00 = instr + -(ulong)(uVar6 << 5);
    }
    else {
      vi_00 = *(Instruction **)(instr + -8);
    }
    if (pIVar9 == vi_00 + (uVar6 << 5)) {
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      return;
    }
    if (!bVar10) {
      pAVar2 = *(ApproxCheck **)pIVar9;
      if (pAVar2 == (ApproxCheck *)0x0) {
        __assert_fail("Val && \"isa<> used on a null pointer\"",
                      "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x5a,
                      "static bool llvm::isa_impl_cl<llvm::Instruction, llvm::Value *>::doit(const From *) [To = llvm::Instruction, From = llvm::Value *]"
                     );
      }
      if (0x1a < (byte)pAVar2->field_0x10) {
        local_d0 = pAVar2;
        markInstruction(pAVar2,vi_00);
        pcVar7 = (char *)llvm::Instruction::getOpcodeName((byte)local_d0->field_0x10 - 0x1b);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_90,pcVar7,(allocator<char> *)&local_b0);
        iVar5 = std::__cxx11::string::compare((char *)local_90);
        if (iVar5 != 0) {
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                    (&local_a8,
                     (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)local_b8);
          ppIVar3 = local_a8.
                    super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (local_a8.super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start <
              local_a8.super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              ppIVar8 = ppIVar3 + 1;
              bVar4 = llvm::Instruction::isIdenticalTo(*ppIVar3);
              ppIVar3 = ppIVar8;
            } while ((local_a8.
                      super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish <= ppIVar8 | bVar4) != 1);
            if (local_a8.
                super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.
                              super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8.
                                    super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_a8.
                                    super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar4 != 0) goto LAB_001040a5;
          }
          else if (local_a8.
                   super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.
                            super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.
                                  super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.
                                  super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          __position._M_current = *(Instruction ***)(local_b8 + 8);
          if (__position._M_current == *(Instruction ***)(local_b8 + 0x10)) {
            std::vector<llvm::Instruction*,std::allocator<llvm::Instruction*>>::
            _M_realloc_insert<llvm::Instruction*const&>
                      (local_b8,__position,(Instruction **)&local_d0);
          }
          else {
            *__position._M_current = (Instruction *)local_d0;
            *(long *)(local_b8 + 8) = *(long *)(local_b8 + 8) + 8;
          }
          pAVar2 = local_d0;
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                    (&local_68,
                     (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)local_b8);
          checkUseChain(local_c0,(Instruction *)pAVar2,local_c4,&local_68);
          if (local_68.super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.
                            super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_68.
                                  super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.
                                  super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
LAB_001040a5:
        pcVar7 = "load";
        iVar5 = std::__cxx11::string::compare((char *)local_90);
        if (iVar5 == 0) {
          local_b0 = findAddressDependency(local_d0,(Instruction *)pcVar7);
          bVar10 = isInAddrList(local_c0,local_b0);
          if (!bVar10) {
            __position_00._M_current =
                 (local_c0->addrList).
                 super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (local_c0->addrList).
                super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
              _M_realloc_insert<llvm::Value*const&>(local_70,__position_00,&local_b0);
            }
            else {
              *__position_00._M_current = local_b0;
              pppVVar1 = &(local_c0->addrList).
                          super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppVVar1 = *pppVVar1 + 1;
            }
          }
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        uVar6 = *(uint *)(instr + 0x14);
      }
    }
    pIVar9 = pIVar9 + 0x20;
    bVar10 = false;
  } while( true );
}

Assistant:

void checkUseChain(Instruction* instr, int level, std::vector<Instruction*> history) {
			std::string opcode = instr->getOpcodeName();
			bool skipFirst = (opcode == "store");

			for (User::op_iterator i = instr->op_begin(); i != instr->op_end(); i++) {
				if (skipFirst) {
					skipFirst = false;
				} else if (isa<Instruction>(*i)) {
					Instruction *vi = dyn_cast<Instruction>(*i);
					markInstruction(vi);

					// Print
					// for (int j = 0; j < level; j++) { errs() << "\t"; }
					// errs() << "(" << level << ")" << *vi << "\n";

					std::string newopcode = vi->getOpcodeName();
					if (newopcode != "load" && !vectorContains(history, vi)) {
						history.push_back(vi);
						ApproxCheck::checkUseChain(vi, level + 1, history);
					}

					if (newopcode == "load") {
						// Found some "address" stored in memory.
						Value* evalAddrInst = findAddressDependency(vi);
						if(!isInAddrList(evalAddrInst)) {
							addrList.push_back(evalAddrInst);
						}
					}
				}
			}
		}